

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryStateUpdate::iterate
          (TransformFeedbackOverflowQueryStateUpdate *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TestError *this_00;
  GLuint index;
  uint uVar4;
  uint index_00;
  long lVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryContextStateBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x20))(0x82ec,this->m_overflow_query);
  bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                    (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ec,0,
                     this->m_overflow_query);
  if (bVar1) {
    (**(code **)(lVar3 + 0x628))(0x82ec);
    bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                      (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ec,0,0);
    if (bVar1) {
      bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                        ((TransformFeedbackOverflowQueryBaseTest *)this);
      if (bVar1) {
        uVar4 = (this->super_TransformFeedbackOverflowQueryContextStateBase).
                super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams;
        for (index = 0; index < uVar4; index = index + 1) {
          (**(code **)(lVar3 + 0x28))(0x82ed,index,this->m_stream_overflow_query);
          for (uVar4 = 0;
              uVar4 < (this->super_TransformFeedbackOverflowQueryContextStateBase).
                      super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams;
              uVar4 = uVar4 + 1) {
            if (index == uVar4) {
              bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                                (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ed,
                                 index,this->m_stream_overflow_query);
              if (!bVar1) {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,
                           "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB is not updated properly after a call to BeginQueryIndexed"
                           ,(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                           ,0x170);
                goto LAB_00939d99;
              }
            }
            else {
              bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                                (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ed,
                                 uVar4,0);
              if (!bVar1) {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,
                           "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB is incorrectly updated for an unrelated vertex streamindex after a call to BeginQueryIndexed"
                           ,(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                           ,0x179);
                goto LAB_00939d99;
              }
            }
          }
          (**(code **)(lVar3 + 0x630))(0x82ed);
          for (index_00 = 0;
              uVar4 = (this->super_TransformFeedbackOverflowQueryContextStateBase).
                      super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams,
              index_00 < uVar4; index_00 = index_00 + 1) {
            if (index == index_00) {
              bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                                (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ed,
                                 index,0);
              if (!bVar1) {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,
                           "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB is not reset properly after a call to EndQueryIndexed"
                           ,(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                           ,0x189);
                goto LAB_00939d99;
              }
            }
            else {
              bVar1 = TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
                                (&this->super_TransformFeedbackOverflowQueryContextStateBase,0x82ed,
                                 index_00,0);
              if (!bVar1) {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,
                           "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB is incorrectly updated for an unrelated vertex streamindex after a call to EndQueryIndexed"
                           ,(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                           ,0x192);
                goto LAB_00939d99;
              }
            }
          }
        }
      }
      tcu::TestContext::setTestResult
                ((this->super_TransformFeedbackOverflowQueryContextStateBase).
                 super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,
               "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is not reset properly after a call to EndQuery"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
               ,0x15d);
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,
               "Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is not updated properly after a call to BeginQuery"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
               ,0x153);
  }
LAB_00939d99:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// Call BeginQuery
		gl.beginQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, m_overflow_query);

		// Verify that CURRENT_QUERY is set to the name of the query
		if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, 0, m_overflow_query))
		{
			TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is not updated properly "
					 "after a call to BeginQuery");
		}

		// Call EndQuery
		gl.endQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB);

		// Verify that CURRENT_QUERY is reset to zero
		if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, 0, 0))
		{
			TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_OVERFLOW_ARB is not reset properly "
					 "after a call to EndQuery");
		}

		if (supportsTransformFeedback3())
		{
			for (GLuint i = 0; i < getMaxVertexStreams(); ++i)
			{
				// Call BeginQueryIndexed with specified index
				gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i, m_stream_overflow_query);

				// Verify that CURRENT_QUERY is set to the name of the query for the specified index, but remains zero for other indices
				for (GLuint j = 0; j < getMaxVertexStreams(); ++j)
				{
					if (i == j)
					{
						if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, j,
													 m_stream_overflow_query))
						{
							TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB "
									 "is not updated properly after a call to BeginQueryIndexed");
						}
					}
					else
					{
						if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, j, 0))
						{
							TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB "
									 "is incorrectly updated for an unrelated vertex stream"
									 "index after a call to BeginQueryIndexed");
						}
					}
				}

				// Call EndQueryIndexed with specified index
				gl.endQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i);

				// Verify that CURRENT_QUERY is reset to zero for the specified index and still remains zero for other indices
				for (GLuint j = 0; j < getMaxVertexStreams(); ++j)
				{
					if (i == j)
					{
						if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, j, 0))
						{
							TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB "
									 "is not reset properly after a call to EndQueryIndexed");
						}
					}
					else
					{
						if (!verifyCurrentQueryState(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, j, 0))
						{
							TCU_FAIL("Value of CURRENT_QUERY for query target TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB "
									 "is incorrectly updated for an unrelated vertex stream"
									 "index after a call to EndQueryIndexed");
						}
					}
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}